

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateEnum
          (Generator *this,GeneratorOptions *options,Printer *printer,EnumDescriptor *enumdesc)

{
  value_type_conflict vVar1;
  EnumDescriptor *this_00;
  bool bVar2;
  int iVar3;
  string *psVar4;
  EnumOptions *this_01;
  EnumValueDescriptor *this_02;
  reference piVar5;
  reference pvVar6;
  AlphaNum *a;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  byte local_1b2;
  char *local_190;
  AlphaNum local_188;
  string local_158;
  string local_138;
  EnumValueDescriptor *local_118;
  EnumValueDescriptor *value;
  iterator iStack_108;
  int i_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  string local_d8;
  _Base_ptr local_b8;
  byte local_b0;
  value_type_conflict local_a4;
  undefined1 local_a0 [4];
  int i;
  vector<int,_std::allocator<int>_> valid_index;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_name;
  string local_48;
  EnumDescriptor *local_28;
  EnumDescriptor *enumdesc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = enumdesc;
  enumdesc_local = (EnumDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetEnumPathPrefix_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)enumdesc,enumdesc);
  psVar4 = EnumDescriptor::name_abi_cxx11_(local_28);
  io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"/**\n * @enum {number}\n */\n$enumprefix$$name$ = {\n",
             (char (*) [11])"enumprefix",&local_48,(char (*) [5])0x77db8d,psVar4);
  std::__cxx11::string::~string((string *)&local_48);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>((Printer *)enumdesc_local,"name",local_28)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_a0);
  for (local_a4 = 0; vVar1 = local_a4, iVar3 = EnumDescriptor::value_count(local_28), vVar1 < iVar3;
      local_a4 = local_a4 + 1) {
    this_01 = EnumDescriptor::options(local_28);
    bVar2 = EnumOptions::allow_alias(this_01);
    local_1b2 = 0;
    if (bVar2) {
      this_02 = EnumDescriptor::value(local_28,local_a4);
      psVar4 = EnumValueDescriptor::name_abi_cxx11_(this_02);
      anon_unknown_0::ToEnumCase(&local_d8,psVar4);
      pVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&local_d8);
      local_b8 = (_Base_ptr)pVar7.first._M_node;
      local_b0 = pVar7.second;
      local_1b2 = local_b0 ^ 0xff;
      std::__cxx11::string::~string((string *)&local_d8);
    }
    if ((local_1b2 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_a0,&local_a4);
    }
  }
  __end3 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_a0);
  iStack_108 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a0);
  while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffef8), bVar2) {
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end3);
    value._4_4_ = *piVar5;
    local_118 = EnumDescriptor::value(local_28,value._4_4_);
    this_00 = enumdesc_local;
    psVar4 = EnumValueDescriptor::name_abi_cxx11_(local_118);
    anon_unknown_0::ToEnumCase(&local_138,psVar4);
    iVar3 = EnumValueDescriptor::number(local_118);
    strings::AlphaNum::AlphaNum(&local_188,iVar3);
    StrCat_abi_cxx11_(&local_158,(protobuf *)&local_188,a);
    iVar3 = value._4_4_;
    pvVar6 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)local_a0);
    local_190 = ",";
    if (iVar3 == *pvVar6) {
      local_190 = "";
    }
    io::Printer::
    Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[6],char_const*>
              ((Printer *)this_00,"  $name$: $value$$comma$\n",(char (*) [5])0x77db8d,&local_138,
               (char (*) [6])0x7c8c1c,&local_158,(char (*) [6])"comma",&local_190);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    io::Printer::Annotate<google::protobuf::EnumValueDescriptor>
              ((Printer *)enumdesc_local,"name",local_118);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end3);
  }
  io::Printer::Print<>((Printer *)enumdesc_local,"};\n\n");
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Generator::GenerateEnum(const GeneratorOptions& options,
                             io::Printer* printer,
                             const EnumDescriptor* enumdesc) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$enumprefix$$name$ = {\n",
      "enumprefix", GetEnumPathPrefix(options, enumdesc), "name",
      enumdesc->name());
  printer->Annotate("name", enumdesc);

  std::set<std::string> used_name;
  std::vector<int> valid_index;
  for (int i = 0; i < enumdesc->value_count(); i++) {
    if (enumdesc->options().allow_alias() &&
        !used_name.insert(ToEnumCase(enumdesc->value(i)->name())).second) {
      continue;
    }
    valid_index.push_back(i);
  }
  for (auto i : valid_index) {
    const EnumValueDescriptor* value = enumdesc->value(i);
    printer->Print("  $name$: $value$$comma$\n", "name",
                   ToEnumCase(value->name()), "value", StrCat(value->number()),
                   "comma", (i == valid_index.back()) ? "" : ",");
    printer->Annotate("name", value);
  }

  printer->Print(
      "};\n"
      "\n");
}